

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::objectivec::ImportWriter::ProtoFrameworkCollector::ConsumeLine
          (ProtoFrameworkCollector *this,StringPiece *line,string *out_error)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  bool bVar2;
  size_type sVar3;
  pointer ppVar4;
  ostream *poVar5;
  mapped_type *this_00;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  _Self local_130;
  string local_128;
  _Self local_108;
  iterator existing_entry;
  StringPiece proto_file;
  undefined1 auStack_e8 [4];
  int start;
  StringPiece proto_file_list;
  StringPiece framework_name;
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_2c;
  string *psStack_28;
  int offset;
  string *out_error_local;
  StringPiece *line_local;
  ProtoFrameworkCollector *this_local;
  
  psStack_28 = out_error;
  out_error_local = (string *)line;
  line_local = (StringPiece *)this;
  sVar3 = stringpiece_internal::StringPiece::find(line,':',0);
  local_2c = (int)sVar3;
  if (local_2c == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_90,"Framework/proto file mapping line without colon sign: \'",
               &local_91);
    stringpiece_internal::StringPiece::operator_cast_to_string
              ((string *)&framework_name.length_,(StringPiece *)out_error_local);
    std::operator+(&local_70,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &framework_name.length_);
    std::operator+(&local_50,&local_70,"\'.");
    std::__cxx11::string::operator=((string *)psStack_28,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&framework_name.length_);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    this_local._7_1_ = false;
  }
  else {
    join_0x00000010_0x00000000_ =
         stringpiece_internal::StringPiece::substr((StringPiece *)out_error_local,0,(long)local_2c);
    _auStack_e8 = stringpiece_internal::StringPiece::substr
                            ((StringPiece *)out_error_local,(long)(local_2c + 1),0xffffffffffffffff)
    ;
    TrimWhitespace((StringPiece *)&proto_file_list.length_);
    proto_file.length_._4_4_ = 0;
    while (sVar3 = stringpiece_internal::StringPiece::length((StringPiece *)auStack_e8),
          (ulong)(long)proto_file.length_._4_4_ < sVar3) {
      sVar3 = stringpiece_internal::StringPiece::find
                        ((StringPiece *)auStack_e8,',',(long)proto_file.length_._4_4_);
      local_2c = (int)sVar3;
      if (local_2c == -1) {
        sVar3 = stringpiece_internal::StringPiece::length((StringPiece *)auStack_e8);
        local_2c = (int)sVar3;
      }
      _existing_entry =
           stringpiece_internal::StringPiece::substr
                     ((StringPiece *)auStack_e8,(long)proto_file.length_._4_4_,
                      (long)(local_2c - proto_file.length_._4_4_));
      TrimWhitespace((StringPiece *)&existing_entry);
      bVar2 = stringpiece_internal::StringPiece::empty((StringPiece *)&existing_entry);
      if (!bVar2) {
        pmVar1 = this->map_;
        stringpiece_internal::StringPiece::operator_cast_to_string
                  (&local_128,(StringPiece *)&existing_entry);
        local_108._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(pmVar1,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        local_130._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end(this->map_);
        bVar2 = std::operator!=(&local_108,&local_130);
        if (bVar2) {
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "warning: duplicate proto file reference, replacing framework entry for \'"
                                  );
          stringpiece_internal::StringPiece::operator_cast_to_string
                    (&local_150,(StringPiece *)&existing_entry);
          poVar5 = std::operator<<(poVar5,(string *)&local_150);
          poVar5 = std::operator<<(poVar5,"\' with \'");
          stringpiece_internal::StringPiece::operator_cast_to_string
                    (&local_170,(StringPiece *)&proto_file_list.length_);
          poVar5 = std::operator<<(poVar5,(string *)&local_170);
          poVar5 = std::operator<<(poVar5,"\' (was \'");
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator->(&local_108);
          poVar5 = std::operator<<(poVar5,(string *)&ppVar4->second);
          poVar5 = std::operator<<(poVar5,"\').");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_150);
          std::ostream::flush();
        }
        sVar3 = stringpiece_internal::StringPiece::find((StringPiece *)&existing_entry,' ',0);
        if (sVar3 != 0xffffffffffffffff) {
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "note: framework mapping file had a proto file with a space in, hopefully that isn\'t a missing comma: \'"
                                  );
          stringpiece_internal::StringPiece::operator_cast_to_string
                    (&local_190,(StringPiece *)&existing_entry);
          poVar5 = std::operator<<(poVar5,(string *)&local_190);
          poVar5 = std::operator<<(poVar5,"\'");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_190);
          std::ostream::flush();
        }
        stringpiece_internal::StringPiece::operator_cast_to_string
                  (&local_1b0,(StringPiece *)&proto_file_list.length_);
        pmVar1 = this->map_;
        stringpiece_internal::StringPiece::operator_cast_to_string
                  (&local_1d0,(StringPiece *)&existing_entry);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](pmVar1,&local_1d0);
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1b0);
      }
      proto_file.length_._4_4_ = local_2c + 1;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ImportWriter::ProtoFrameworkCollector::ConsumeLine(
    const StringPiece& line, std::string* out_error) {
  int offset = line.find(':');
  if (offset == StringPiece::npos) {
    *out_error =
        std::string("Framework/proto file mapping line without colon sign: '") +
        std::string(line) + "'.";
    return false;
  }
  StringPiece framework_name = line.substr(0, offset);
  StringPiece proto_file_list = line.substr(offset + 1);
  TrimWhitespace(&framework_name);

  int start = 0;
  while (start < proto_file_list.length()) {
    offset = proto_file_list.find(',', start);
    if (offset == StringPiece::npos) {
      offset = proto_file_list.length();
    }

    StringPiece proto_file = proto_file_list.substr(start, offset - start);
    TrimWhitespace(&proto_file);
    if (!proto_file.empty()) {
      std::map<std::string, std::string>::iterator existing_entry =
          map_->find(std::string(proto_file));
      if (existing_entry != map_->end()) {
        std::cerr << "warning: duplicate proto file reference, replacing "
                     "framework entry for '"
                  << std::string(proto_file) << "' with '" << std::string(framework_name)
                  << "' (was '" << existing_entry->second << "')." << std::endl;
        std::cerr.flush();
      }

      if (proto_file.find(' ') != StringPiece::npos) {
        std::cerr << "note: framework mapping file had a proto file with a "
                     "space in, hopefully that isn't a missing comma: '"
                  << std::string(proto_file) << "'" << std::endl;
        std::cerr.flush();
      }

      (*map_)[std::string(proto_file)] = std::string(framework_name);
    }

    start = offset + 1;
  }

  return true;
}